

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.h
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTest::PreEncodeFrameHook
          (DatarateTest *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int extraout_var;
  SEARCH_METHODS *message;
  AssertionResult gtest_ar;
  Message local_50;
  AssertHelper local_48;
  internal local_40 [8];
  undefined8 *local_38;
  
  iVar1 = (*video->_vptr_VideoSource[8])(video);
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(encoder,0xd,this->set_cpu_used_);
    libaom_test::Encoder::Control(encoder,0x28,this->aq_mode_);
    if (this->auto_tiles_ == true) {
      iVar2 = 0xa6;
      iVar1 = 1;
    }
    else {
      libaom_test::Encoder::Control(encoder,0x21,this->tile_columns_);
      iVar1 = this->tile_rows_;
      iVar2 = 0x22;
    }
    libaom_test::Encoder::Control(encoder,iVar2,iVar1);
    libaom_test::Encoder::Control(encoder,0x20,1);
    if ((this->super_EncoderTest).cfg_.g_usage == 1) {
      libaom_test::Encoder::Control(encoder,0x5f,0);
      libaom_test::Encoder::Control(encoder,0x60,0);
      libaom_test::Encoder::Control(encoder,0x3b,0);
      libaom_test::Encoder::Control(encoder,0x3d,0);
      libaom_test::Encoder::Control(encoder,0x6b,0);
      libaom_test::Encoder::Control(encoder,0x23,0);
      libaom_test::Encoder::Control(encoder,0x3a,1);
      libaom_test::Encoder::Control(encoder,0x7e,2);
      libaom_test::Encoder::Control(encoder,0x7f,2);
      libaom_test::Encoder::Control(encoder,0x80,2);
      libaom_test::Encoder::Control(encoder,0x8e,2);
      libaom_test::Encoder::Control(encoder,0xa8,1);
    }
    if (this->screen_mode_ == true) {
      libaom_test::Encoder::Control(encoder,0x2b,1);
      libaom_test::Encoder::Control(encoder,0x68,1);
      libaom_test::Encoder::Control(encoder,0x69,0);
    }
    if (this->avif_mode_ != 0) {
      libaom_test::Encoder::Control(encoder,0x7e,0);
      libaom_test::Encoder::Control(encoder,0x7f,0);
      libaom_test::Encoder::Control(encoder,0x80,0);
      libaom_test::Encoder::Control(encoder,0x6b,3);
      libaom_test::Encoder::Control(encoder,0x3f,1);
      libaom_test::Encoder::Control(encoder,0x10,1);
      libaom_test::Encoder::Control(encoder,0x57,1);
      libaom_test::Encoder::Control(encoder,0x19,0);
      libaom_test::Encoder::Control(encoder,0x28,(uint)(this->aq_mode_ != 0));
    }
  }
  if (this->speed_change_test_ == true) {
    iVar1 = (*video->_vptr_VideoSource[8])(video);
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar2 = (*video->_vptr_VideoSource[8])(video);
      iVar1 = 7;
      if (iVar2 != 0x1e) {
        iVar2 = (*video->_vptr_VideoSource[8])(video);
        iVar1 = 6;
        if (iVar2 != 0x3c) {
          iVar2 = (*video->_vptr_VideoSource[8])(video);
          iVar1 = 7;
          if (iVar2 != 0x5a) goto LAB_00635b33;
        }
      }
    }
    libaom_test::Encoder::Control(encoder,0xd,iVar1);
  }
LAB_00635b33:
  iVar1 = this->frame_update_bitrate_;
  if (0 < iVar1) {
    if (this->frame_number_ == iVar1) {
      piVar3 = this->target_bitrate_update_ + 1;
    }
    else {
      if (this->frame_number_ != iVar1 * 2) goto LAB_00635b71;
      piVar3 = this->target_bitrate_update_ + 2;
    }
    (this->super_EncoderTest).cfg_.rc_target_bitrate = *piVar3;
    libaom_test::Encoder::Config(encoder,&(this->super_EncoderTest).cfg_);
  }
LAB_00635b71:
  if (this->denoiser_offon_test_ != 0) {
    local_50.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    testing::internal::CmpHelperGT<int,int>
              (local_40,"denoiser_offon_period_","0",&this->denoiser_offon_period_,(int *)&local_50)
    ;
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(local_50.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_50.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) + 0x10),"denoiser_offon_period_ is not positive.",
                 0x27);
      if (local_38 == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = (SEARCH_METHODS *)*local_38;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.h"
                 ,0x86,(char *)message);
      testing::internal::AssertHelper::operator=(&local_48,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((long *)CONCAT44(local_50.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_50.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_50.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (local_38 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_38 != local_38 + 2) {
        operator_delete((undefined8 *)*local_38);
      }
      operator_delete(local_38);
    }
    if (local_40[0] == (internal)0x0) {
      return;
    }
    iVar1 = (*video->_vptr_VideoSource[8])(video);
    if ((iVar1 + 1U) % (uint)this->denoiser_offon_period_ == 0) {
      *(byte *)&this->denoiser_on_ = (byte)this->denoiser_on_ ^ 1;
    }
  }
  libaom_test::Encoder::Control(encoder,0x2a,this->denoiser_on_);
  iVar1 = (*video->_vptr_VideoSource[7])(video);
  this->timebase_ = (double)iVar1 / (double)extraout_var;
  this->duration_ = 0.0;
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AV1E_SET_AQ_MODE, aq_mode_);
      if (auto_tiles_) {
        encoder->Control(AV1E_SET_AUTO_TILES, 1);
      } else {
        encoder->Control(AV1E_SET_TILE_COLUMNS, tile_columns_);
        encoder->Control(AV1E_SET_TILE_ROWS, tile_rows_);
      }
      encoder->Control(AV1E_SET_ROW_MT, 1);
      if (cfg_.g_usage == AOM_USAGE_REALTIME) {
        encoder->Control(AV1E_SET_ENABLE_GLOBAL_MOTION, 0);
        encoder->Control(AV1E_SET_ENABLE_WARPED_MOTION, 0);
        encoder->Control(AV1E_SET_ENABLE_RESTORATION, 0);
        encoder->Control(AV1E_SET_ENABLE_OBMC, 0);
        encoder->Control(AV1E_SET_DELTAQ_MODE, 0);
        encoder->Control(AV1E_SET_ENABLE_TPL_MODEL, 0);
        encoder->Control(AV1E_SET_ENABLE_CDEF, 1);
        encoder->Control(AV1E_SET_COEFF_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_MODE_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_MV_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_DV_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_POSTENCODE_DROP_RTC, 1);
      }
      if (screen_mode_) {
        encoder->Control(AV1E_SET_TUNE_CONTENT, AOM_CONTENT_SCREEN);
        encoder->Control(AV1E_SET_ENABLE_PALETTE, 1);
        encoder->Control(AV1E_SET_ENABLE_INTRABC, 0);
      }
      if (avif_mode_) {
        encoder->Control(AV1E_SET_COEFF_COST_UPD_FREQ, 0);
        encoder->Control(AV1E_SET_MODE_COST_UPD_FREQ, 0);
        encoder->Control(AV1E_SET_MV_COST_UPD_FREQ, 0);
#if !CONFIG_REALTIME_ONLY
        encoder->Control(AV1E_SET_DELTAQ_MODE, 3);
#endif
#if CONFIG_QUANT_MATRIX
        encoder->Control(AV1E_SET_ENABLE_QM, 1);
#endif
        encoder->Control(AOME_SET_SHARPNESS, 1);
        encoder->Control(AV1E_SET_ENABLE_CHROMA_DELTAQ, 1);
        encoder->Control(AOME_SET_CQ_LEVEL, 0);
        encoder->Control(AV1E_SET_AQ_MODE, (aq_mode_ > 0) ? 1 : 0);
      }
    }

    if (speed_change_test_) {
      if (video->frame() == 0) {
        encoder->Control(AOME_SET_CPUUSED, 8);
      } else if (video->frame() == 30) {
        encoder->Control(AOME_SET_CPUUSED, 7);
      } else if (video->frame() == 60) {
        encoder->Control(AOME_SET_CPUUSED, 6);
      } else if (video->frame() == 90) {
        encoder->Control(AOME_SET_CPUUSED, 7);
      }
    }

    if (frame_update_bitrate_ > 0) {
      if (frame_number_ == frame_update_bitrate_) {
        cfg_.rc_target_bitrate = target_bitrate_update_[1];
        encoder->Config(&cfg_);
      } else if (frame_number_ == 2 * frame_update_bitrate_) {
        cfg_.rc_target_bitrate = target_bitrate_update_[2];
        encoder->Config(&cfg_);
      }
    }

    if (denoiser_offon_test_) {
      ASSERT_GT(denoiser_offon_period_, 0)
          << "denoiser_offon_period_ is not positive.";
      if ((video->frame() + 1) % denoiser_offon_period_ == 0) {
        // Flip denoiser_on_ periodically
        denoiser_on_ ^= 1;
      }
    }

    encoder->Control(AV1E_SET_NOISE_SENSITIVITY, denoiser_on_);

    const aom_rational_t tb = video->timebase();
    timebase_ = static_cast<double>(tb.num) / tb.den;
    duration_ = 0;
  }